

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

void swap(nghttp2_pq *pq,size_t i,size_t j)

{
  nghttp2_pq_entry *pnVar1;
  nghttp2_pq_entry *pnVar2;
  nghttp2_pq_entry *b;
  nghttp2_pq_entry *a;
  size_t j_local;
  size_t i_local;
  nghttp2_pq *pq_local;
  
  pnVar1 = pq->q[i];
  pnVar2 = pq->q[j];
  pq->q[i] = pnVar2;
  pnVar2->index = i;
  pq->q[j] = pnVar1;
  pnVar1->index = j;
  return;
}

Assistant:

static void swap(nghttp2_pq *pq, size_t i, size_t j) {
  nghttp2_pq_entry *a = pq->q[i];
  nghttp2_pq_entry *b = pq->q[j];

  pq->q[i] = b;
  b->index = i;
  pq->q[j] = a;
  a->index = j;
}